

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::Group::Add(Group *this,Base *child)

{
  Base **in_RDI;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *unaff_retaddr;
  
  std::vector<args::Base*,std::allocator<args::Base*>>::emplace_back<args::Base*>
            (unaff_retaddr,in_RDI);
  return;
}

Assistant:

void Add(Base &child)
            {
                children.emplace_back(&child);
            }